

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringClass.cpp
# Opt level: O1

void __thiscall String::trim(String *this,int n)

{
  String local_30;
  
  if (n < 1) {
    mid(&local_30,this,(long)n,-1);
    std::__cxx11::string::_M_assign((string *)this);
  }
  else {
    mid(&local_30,this,0,(long)((int)(this->_string)._M_string_length - n));
    std::__cxx11::string::_M_assign((string *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._string._M_dataplus._M_p != &local_30._string.field_2) {
    operator_delete(local_30._string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void String::trim (int n)
{
	if (n > 0)
		_string = mid (0, length() - n).stdString();
	else
		_string = mid (n, -1).stdString();
}